

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

void __thiscall LayoutType::LayoutType(LayoutType *this)

{
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"",&local_31);
  this->widgetIndex = 0;
  std::__cxx11::string::string((string *)&this->name,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

LayoutType() : LayoutType(0, "") {}